

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O2

Mpm_Man_t * Mpm_ManStart(Mig_Man_t *pMig,Mpm_Par_t *pPars)

{
  Mpm_LibLut_t *pMVar1;
  int iVar2;
  Mpm_Man_t *p;
  ulong uVar3;
  Mmr_Step_t *pMVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  Vec_Mem_t *pVVar7;
  Vec_Int_t *pVVar8;
  abctime aVar9;
  int *piVar10;
  ulong uVar11;
  int iVar12;
  char *__assertion;
  uint uVar13;
  long lVar14;
  word *pEntry;
  
  if (0x20 < pPars->nNumCuts) {
    __assertion = "pPars->nNumCuts <= MPM_CUT_MAX";
    uVar13 = 0x32;
LAB_003676d9:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mpm/mpmMan.c"
                  ,uVar13,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseTruth != 0) && (0x10 < pPars->pLib->LutMax)) {
    __assertion = "!pPars->fUseTruth || pPars->pLib->LutMax <= 16";
    uVar13 = 0x33;
    goto LAB_003676d9;
  }
  if ((pPars->fUseDsd != 0) && (6 < pPars->pLib->LutMax)) {
    __assertion = "!pPars->fUseDsd || pPars->pLib->LutMax <= 6";
    uVar13 = 0x34;
    goto LAB_003676d9;
  }
  Mig_ManSetRefs(pMig);
  lVar14 = 1;
  p = (Mpm_Man_t *)calloc(1,0x3688);
  p->pMig = pMig;
  p->pPars = pPars;
  pMVar1 = pPars->pLib;
  p->pLibLut = pMVar1;
  iVar2 = pMVar1->LutMax;
  p->nLutSize = iVar2;
  iVar12 = 1 << ((char)iVar2 - 6U & 0x1f);
  if (iVar2 < 7) {
    iVar12 = 1;
  }
  if (pPars->fUseTruth == 0) {
    iVar12 = 0;
  }
  p->nTruWords = iVar12;
  iVar12 = pPars->nNumCuts;
  p->nNumCuts = iVar12;
  uVar3 = (long)(iVar2 << 2) + 0xcU >> 3;
  uVar13 = (int)uVar3 + 1;
  if (1 < uVar13) {
    uVar13 = 0;
    for (; (uint)uVar3 != 0; uVar3 = (ulong)((uint)uVar3 >> 1)) {
      uVar13 = uVar13 + 1;
    }
  }
  iVar2 = 1 << ((byte)uVar13 & 0x1f);
  pMVar4 = (Mmr_Step_t *)calloc((long)iVar2 * 0x38 + 0x18,1);
  pMVar4->nBits = uVar13;
  pMVar4->uMask = iVar2 + -1;
  piVar10 = &pMVar4[3].nEntriesAll;
  for (; lVar14 < iVar2; lVar14 = lVar14 + 1) {
    if (lVar14 == 0x2000) {
      __assert_fail("nEntryWords > 0 && nEntryWords < (1 << nPageBase)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mem/mem2.h"
                    ,0x96,"void Mmr_FixedCreate(Mmr_Fixed_t *, int, int)");
    }
    *(undefined8 *)(piVar10 + -2) = 0x1fff0000000d;
    *piVar10 = (int)lVar14;
    piVar10 = piVar10 + 0xe;
  }
  p->pManCuts = pMVar4;
  Vec_PtrGrow(&p->vFreeUnits,iVar12 + 1);
  for (uVar13 = p->nNumCuts; -1 < (int)uVar13; uVar13 = uVar13 - 1) {
    iVar2 = (p->vFreeUnits).nSize;
    if (iVar2 == (p->vFreeUnits).nCap) {
      iVar12 = iVar2 * 2;
      if (iVar2 < 0x10) {
        iVar12 = 0x10;
      }
      Vec_PtrGrow(&p->vFreeUnits,iVar12);
      iVar2 = (p->vFreeUnits).nSize;
    }
    (p->vFreeUnits).nSize = iVar2 + 1;
    (p->vFreeUnits).pArray[iVar2] = p->pCutUnits + uVar13;
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  p->vTemp = pVVar5;
  Vec_IntFill(&p->vCutBests,pMig->nObjs,0);
  Vec_IntFill(&p->vCutLists,pMig->nObjs,0);
  Vec_IntFill(&p->vMigRefs,pMig->nObjs,0);
  Vec_IntFill(&p->vMapRefs,pMig->nObjs,0);
  Vec_IntFill(&p->vEstRefs,pMig->nObjs,0);
  Vec_IntFill(&p->vRequireds,pMig->nObjs,1000000000);
  Vec_IntFill(&p->vTimes,pMig->nObjs,0);
  Vec_IntFill(&p->vAreas,pMig->nObjs,0);
  Vec_IntFill(&p->vEdges,pMig->nObjs,0);
  iVar2 = p->pPars->fUseDsd;
  if (p->pPars->fUseTruth == 0) {
    if (iVar2 == 0) goto LAB_00367633;
    Mpm_ManPrecomputePerms(p);
    iVar2 = 1;
  }
  else {
    if (iVar2 != 0) {
      __assertion = "!p->pPars->fUseTruth || !p->pPars->fUseDsd";
      uVar13 = 0x50;
      goto LAB_003676d9;
    }
    iVar2 = p->nTruWords;
    pVVar7 = (Vec_Mem_t *)calloc(1,0x30);
    pVVar7->nEntrySize = iVar2;
    pVVar7->LogPageSze = 0xc;
    pVVar7->PageMask = 0xfff;
    pVVar7->iPage = -1;
    p->vTtMem = pVVar7;
    iVar2 = Abc_PrimeCudd(10000);
    pVVar8 = Vec_IntAlloc(iVar2);
    pVVar8->nSize = iVar2;
    memset(pVVar8->pArray,0xff,(long)iVar2 << 2);
    pVVar7->vTable = pVVar8;
    pVVar8 = Vec_IntAlloc(10000);
    pVVar7->vNexts = pVVar8;
    pEntry = p->Truth;
    iVar2 = Vec_MemHashInsert(p->vTtMem,pEntry);
    p->funcCst0 = iVar2;
    uVar11 = 0;
    uVar3 = (ulong)(uint)p->nTruWords;
    if (p->nTruWords < 1) {
      uVar3 = uVar11;
    }
    for (; uVar3 != uVar11; uVar11 = uVar11 + 1) {
      pEntry[uVar11] = 0xaaaaaaaaaaaaaaaa;
    }
    iVar2 = Vec_MemHashInsert(p->vTtMem,pEntry);
  }
  p->funcVar0 = iVar2;
LAB_00367633:
  aVar9 = Abc_Clock();
  p->timeTotal = aVar9;
  pMig->pMan = p;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mpm_Man_t * Mpm_ManStart( Mig_Man_t * pMig, Mpm_Par_t * pPars )
{
    Mpm_Man_t * p;
    int i;
    assert( sizeof(Mpm_Uni_t) % sizeof(word) == 0 );      // aligned info to word boundary
    assert( pPars->nNumCuts <= MPM_CUT_MAX );
    assert( !pPars->fUseTruth || pPars->pLib->LutMax <= 16 );
    assert( !pPars->fUseDsd || pPars->pLib->LutMax <= 6 );
    Mig_ManSetRefs( pMig );
    // alloc
    p = ABC_CALLOC( Mpm_Man_t, 1 );
    p->pMig      = pMig;
    p->pPars     = pPars;
    p->pLibLut   = pPars->pLib;
    p->nLutSize  = pPars->pLib->LutMax;
    p->nTruWords = pPars->fUseTruth ? Abc_Truth6WordNum(p->nLutSize) : 0;
    p->nNumCuts  = pPars->nNumCuts;
    // cuts
    assert( Mpm_CutWordNum(32) < 32 ); // using 5 bits for word count
    p->pManCuts  = Mmr_StepStart( 13, Abc_Base2Log(Mpm_CutWordNum(p->nLutSize) + 1) );
    Vec_PtrGrow( &p->vFreeUnits, p->nNumCuts + 1 );
    for ( i = p->nNumCuts; i >= 0; i-- )
        Vec_PtrPush( &p->vFreeUnits, p->pCutUnits + i );
    p->vTemp     = Vec_PtrAlloc( 1000 );
    // mapping attributes
    Vec_IntFill( &p->vCutBests, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vCutLists, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMigRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMapRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEstRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vRequireds, Mig_ManObjNum(pMig), ABC_INFINITY );
    Vec_IntFill( &p->vTimes, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vAreas, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEdges, Mig_ManObjNum(pMig), 0 );
    // start DSD manager
    assert( !p->pPars->fUseTruth || !p->pPars->fUseDsd );
    if ( p->pPars->fUseTruth )
    { 
        p->vTtMem = Vec_MemAlloc( p->nTruWords, 12 ); // 32 KB/page for 6-var functions
        Vec_MemHashAlloc( p->vTtMem, 10000 );
        p->funcCst0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
        Abc_TtUnit( p->Truth, p->nTruWords, 0 );
        p->funcVar0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
    }
    else if ( p->pPars->fUseDsd )
    {
        Mpm_ManPrecomputePerms( p );
        p->funcVar0 = 1;
    }
    // finish
    p->timeTotal = Abc_Clock();
    pMig->pMan = p;
    return p;
}